

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RFC1751.cpp
# Opt level: O0

void jbcoin::RFC1751::btoe(string *strHuman,string *strData)

{
  undefined8 *puVar1;
  unsigned_long uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  int local_2c;
  int local_28;
  int i;
  int p;
  char caBuffer [9];
  string *strData_local;
  string *strHuman_local;
  
  caBuffer._1_8_ = strData;
  puVar1 = (undefined8 *)std::__cxx11::string::c_str();
  unique0x00012000 = *puVar1;
  local_28 = 0;
  for (local_2c = 0; local_2c < 0x40; local_2c = local_2c + 2) {
    uVar2 = extract((char *)((long)&i + 3),local_2c,2);
    local_28 = local_28 + (int)uVar2;
  }
  caBuffer[0] = (char)local_28 << 6;
  std::__cxx11::string::string((string *)&local_1b0);
  uVar2 = extract((char *)((long)&i + 3),0,0xb);
  std::operator+(&local_190,&local_1b0,*(char **)(s_dictionary + uVar2 * 8));
  std::operator+(&local_170,&local_190," ");
  uVar2 = extract((char *)((long)&i + 3),0xb,0xb);
  std::operator+(&local_150,&local_170,*(char **)(s_dictionary + uVar2 * 8));
  std::operator+(&local_130,&local_150," ");
  uVar2 = extract((char *)((long)&i + 3),0x16,0xb);
  std::operator+(&local_110,&local_130,*(char **)(s_dictionary + uVar2 * 8));
  std::operator+(&local_f0,&local_110," ");
  uVar2 = extract((char *)((long)&i + 3),0x21,0xb);
  std::operator+(&local_d0,&local_f0,*(char **)(s_dictionary + uVar2 * 8));
  std::operator+(&local_b0,&local_d0," ");
  uVar2 = extract((char *)((long)&i + 3),0x2c,0xb);
  std::operator+(&local_90,&local_b0,*(char **)(s_dictionary + uVar2 * 8));
  std::operator+(&local_70,&local_90," ");
  uVar2 = extract((char *)((long)&i + 3),0x37,0xb);
  std::operator+(&local_50,&local_70,*(char **)(s_dictionary + uVar2 * 8));
  std::__cxx11::string::operator=((string *)strHuman,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_1b0);
  return;
}

Assistant:

void RFC1751::btoe (std::string& strHuman, std::string const& strData)
{
    char    caBuffer[9];     /* add in room for the parity 2 bits*/
    int     p, i;

    memcpy (caBuffer, strData.c_str (), 8);

    // compute parity: merely add groups of two bits.
    for (p = 0, i = 0; i < 64; i += 2)
        p += extract (caBuffer, i, 2);

    caBuffer[8] = char (p) << 6;

    strHuman    = std::string ()
                  + s_dictionary[extract (caBuffer, 0, 11)] + " "
                  + s_dictionary[extract (caBuffer, 11, 11)] + " "
                  + s_dictionary[extract (caBuffer, 22, 11)] + " "
                  + s_dictionary[extract (caBuffer, 33, 11)] + " "
                  + s_dictionary[extract (caBuffer, 44, 11)] + " "
                  + s_dictionary[extract (caBuffer, 55, 11)];
}